

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Packing_x86::forward(Packing_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int *piVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  void *pvVar9;
  long lVar10;
  void *pvVar11;
  uint uVar12;
  void *pvVar13;
  Packing *this_00;
  long lVar14;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  bool bVar21;
  ulong uVar22;
  void *pvVar23;
  int iVar24;
  void *pvVar25;
  int iVar26;
  long lVar27;
  void *pvVar28;
  ulong uVar29;
  undefined4 *puVar30;
  void *pvVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  size_t local_48;
  
  iVar6 = bottom_blob->elempack;
  uVar29 = (ulong)iVar6;
  if (uVar29 == 0) {
    this_00 = (Packing *)((long)&this->_vptr_Packing_x86 + (long)this->_vptr_Packing_x86[-3]);
    goto LAB_002baa0c;
  }
  uVar22 = bottom_blob->elemsize;
  iVar5 = ((int)uVar22 * 8) / iVar6;
  if (iVar5 == 8) {
    iVar6 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar6;
  }
  this_00 = (Packing *)((long)&this->_vptr_Packing_x86 + (long)this->_vptr_Packing_x86[-3]);
  if ((*(int *)(&this->field_0xd4 + (long)this->_vptr_Packing_x86[-3]) != 0) || (iVar5 != 0x20))
  goto LAB_002baa0c;
  iVar5 = this_00->out_elempack;
  if (iVar6 == iVar5) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar6 = bottom_blob->w;
    iVar5 = bottom_blob->h;
    iVar1 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar6;
    top_blob->h = iVar5;
    top_blob->d = iVar1;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  bVar32 = iVar5 == 4 && iVar6 == 1;
  if (iVar6 == 4) {
    bVar33 = iVar5 == 1;
    bVar34 = iVar5 == 8;
    bVar35 = false;
LAB_002ba9c5:
    bVar21 = false;
    bVar15 = false;
  }
  else {
    if (iVar6 == 1) {
      bVar35 = iVar5 == 8;
      bVar34 = false;
      bVar33 = false;
      goto LAB_002ba9c5;
    }
    bVar21 = iVar5 == 1 && iVar6 == 8;
    bVar15 = iVar5 == 4 && iVar6 == 8;
    bVar34 = false;
    bVar35 = false;
    bVar33 = false;
  }
  if ((((bVar15) || (bVar34)) || (bVar21)) || ((bVar35 || (iVar5 == 4 && iVar6 == 1 || bVar33)))) {
    iVar1 = bottom_blob->dims;
    iVar24 = bottom_blob->w;
    uVar17 = bottom_blob->h;
    uVar7 = (ulong)uVar17;
    if (iVar1 == 2) {
      uVar12 = (int)(iVar6 * uVar17) / iVar5;
      if ((int)(iVar6 * uVar17) % iVar5 == 0) {
        Mat::create(top_blob,iVar24,uVar12,(long)iVar5 * (uVar22 / uVar29),iVar5,opt->blob_allocator
                   );
        pvVar20 = top_blob->data;
        if (pvVar20 == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (bVar32 && 0 < (int)uVar12) {
          lVar10 = (long)bottom_blob->w * bottom_blob->elemsize;
          iVar6 = top_blob->w;
          sVar8 = top_blob->elemsize;
          pvVar9 = bottom_blob->data;
          pvVar18 = (void *)(lVar10 * 3 + (long)pvVar9);
          lVar14 = lVar10 * 4;
          pvVar19 = (void *)((long)pvVar9 + lVar10 * 2);
          pvVar11 = (void *)(lVar10 + (long)pvVar9);
          uVar29 = 0;
          do {
            if (0 < iVar24) {
              puVar30 = (undefined4 *)((long)iVar6 * sVar8 * uVar29 + (long)pvVar20);
              lVar10 = 0;
              do {
                *puVar30 = *(undefined4 *)((long)pvVar9 + lVar10 * 4);
                puVar30[1] = *(undefined4 *)((long)pvVar11 + lVar10 * 4);
                puVar30[2] = *(undefined4 *)((long)pvVar19 + lVar10 * 4);
                puVar30[3] = *(undefined4 *)((long)pvVar18 + lVar10 * 4);
                puVar30 = puVar30 + 4;
                lVar10 = lVar10 + 1;
              } while (iVar24 != (int)lVar10);
            }
            uVar29 = uVar29 + 1;
            pvVar18 = (void *)((long)pvVar18 + lVar14);
            pvVar19 = (void *)((long)pvVar19 + lVar14);
            pvVar11 = (void *)((long)pvVar11 + lVar14);
            pvVar9 = (void *)((long)pvVar9 + lVar14);
          } while (uVar29 != uVar12);
        }
        if ((bool)(bVar33 & 0 < (int)uVar17)) {
          iVar6 = bottom_blob->w;
          sVar8 = bottom_blob->elemsize;
          lVar10 = (long)top_blob->w * top_blob->elemsize;
          pvVar9 = bottom_blob->data;
          pvVar13 = (void *)(lVar10 * 3 + (long)pvVar20);
          lVar14 = lVar10 * 4;
          pvVar19 = (void *)((long)pvVar20 + lVar10 * 2);
          pvVar18 = (void *)(lVar10 + (long)pvVar20);
          uVar29 = 0;
          pvVar11 = pvVar20;
          do {
            if (0 < iVar24) {
              puVar30 = (undefined4 *)((long)iVar6 * sVar8 * uVar29 + (long)pvVar9);
              lVar10 = 0;
              do {
                *(undefined4 *)((long)pvVar11 + lVar10 * 4) = *puVar30;
                *(undefined4 *)((long)pvVar18 + lVar10 * 4) = puVar30[1];
                *(undefined4 *)((long)pvVar19 + lVar10 * 4) = puVar30[2];
                *(undefined4 *)((long)pvVar13 + lVar10 * 4) = puVar30[3];
                puVar30 = puVar30 + 4;
                lVar10 = lVar10 + 1;
              } while (iVar24 != (int)lVar10);
            }
            uVar29 = uVar29 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar14);
            pvVar19 = (void *)((long)pvVar19 + lVar14);
            pvVar18 = (void *)((long)pvVar18 + lVar14);
            pvVar11 = (void *)((long)pvVar11 + lVar14);
          } while (uVar29 != uVar7);
        }
        if (bVar35 && 0 < (int)uVar12) {
          lVar10 = (long)bottom_blob->w * bottom_blob->elemsize;
          pvVar18 = bottom_blob->data;
          iVar6 = top_blob->w;
          sVar8 = top_blob->elemsize;
          lVar14 = lVar10 * 8;
          pvVar28 = (void *)(lVar10 * 7 + (long)pvVar18);
          pvVar19 = (void *)((long)pvVar18 + lVar10 * 6);
          pvVar25 = (void *)(lVar10 * 5 + (long)pvVar18);
          pvVar9 = (void *)((long)pvVar18 + lVar10 * 4);
          pvVar31 = (void *)(lVar10 * 3 + (long)pvVar18);
          pvVar11 = (void *)((long)pvVar18 + lVar10 * 2);
          pvVar23 = (void *)(lVar10 + (long)pvVar18);
          uVar29 = 0;
          pvVar13 = pvVar20;
          do {
            if (0 < iVar24) {
              lVar10 = 0;
              uVar16 = iVar24 + 1;
              do {
                *(undefined4 *)((long)pvVar13 + lVar10 * 8) =
                     *(undefined4 *)((long)pvVar18 + lVar10);
                *(undefined4 *)((long)pvVar13 + lVar10 * 8 + 4) =
                     *(undefined4 *)((long)pvVar23 + lVar10);
                *(undefined4 *)((long)pvVar13 + lVar10 * 8 + 8) =
                     *(undefined4 *)((long)pvVar11 + lVar10);
                *(undefined4 *)((long)pvVar13 + lVar10 * 8 + 0xc) =
                     *(undefined4 *)((long)pvVar31 + lVar10);
                *(undefined4 *)((long)pvVar13 + lVar10 * 8 + 0x10) =
                     *(undefined4 *)((long)pvVar9 + lVar10);
                *(undefined4 *)((long)pvVar13 + lVar10 * 8 + 0x14) =
                     *(undefined4 *)((long)pvVar25 + lVar10);
                *(undefined4 *)((long)pvVar13 + lVar10 * 8 + 0x18) =
                     *(undefined4 *)((long)pvVar19 + lVar10);
                *(undefined4 *)((long)pvVar13 + lVar10 * 8 + 0x1c) =
                     *(undefined4 *)((long)pvVar28 + lVar10);
                uVar16 = uVar16 - 1;
                lVar10 = lVar10 + 4;
              } while (1 < uVar16);
            }
            uVar29 = uVar29 + 1;
            pvVar13 = (void *)((long)pvVar13 + (long)iVar6 * sVar8);
            pvVar28 = (void *)((long)pvVar28 + lVar14);
            pvVar19 = (void *)((long)pvVar19 + lVar14);
            pvVar25 = (void *)((long)pvVar25 + lVar14);
            pvVar9 = (void *)((long)pvVar9 + lVar14);
            pvVar31 = (void *)((long)pvVar31 + lVar14);
            pvVar11 = (void *)((long)pvVar11 + lVar14);
            pvVar23 = (void *)((long)pvVar23 + lVar14);
            pvVar18 = (void *)((long)pvVar18 + lVar14);
          } while (uVar29 != uVar12);
        }
        if ((bool)(bVar21 & 0 < (int)uVar17)) {
          pvVar18 = bottom_blob->data;
          iVar6 = bottom_blob->w;
          lVar10 = (long)top_blob->w * top_blob->elemsize;
          lVar14 = lVar10 * 8;
          pvVar28 = (void *)(lVar10 * 7 + (long)pvVar20);
          pvVar19 = (void *)((long)pvVar20 + lVar10 * 6);
          pvVar25 = (void *)(lVar10 * 5 + (long)pvVar20);
          pvVar9 = (void *)((long)pvVar20 + lVar10 * 4);
          pvVar31 = (void *)(lVar10 * 3 + (long)pvVar20);
          pvVar11 = (void *)((long)pvVar20 + lVar10 * 2);
          pvVar23 = (void *)(lVar10 + (long)pvVar20);
          sVar8 = bottom_blob->elemsize;
          uVar29 = 0;
          pvVar13 = pvVar20;
          do {
            if (0 < iVar24) {
              lVar10 = 0;
              uVar16 = iVar24 + 1;
              do {
                *(undefined4 *)((long)pvVar13 + lVar10) =
                     *(undefined4 *)((long)pvVar18 + lVar10 * 8);
                *(undefined4 *)((long)pvVar23 + lVar10) =
                     *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 4);
                *(undefined4 *)((long)pvVar11 + lVar10) =
                     *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 8);
                *(undefined4 *)((long)pvVar31 + lVar10) =
                     *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0xc);
                *(undefined4 *)((long)pvVar9 + lVar10) =
                     *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x10);
                *(undefined4 *)((long)pvVar25 + lVar10) =
                     *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x14);
                *(undefined4 *)((long)pvVar19 + lVar10) =
                     *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x18);
                *(undefined4 *)((long)pvVar28 + lVar10) =
                     *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x1c);
                uVar16 = uVar16 - 1;
                lVar10 = lVar10 + 4;
              } while (1 < uVar16);
            }
            uVar29 = uVar29 + 1;
            pvVar28 = (void *)((long)pvVar28 + lVar14);
            pvVar19 = (void *)((long)pvVar19 + lVar14);
            pvVar25 = (void *)((long)pvVar25 + lVar14);
            pvVar9 = (void *)((long)pvVar9 + lVar14);
            pvVar31 = (void *)((long)pvVar31 + lVar14);
            pvVar11 = (void *)((long)pvVar11 + lVar14);
            pvVar23 = (void *)((long)pvVar23 + lVar14);
            pvVar13 = (void *)((long)pvVar13 + lVar14);
            pvVar18 = (void *)((long)pvVar18 + (long)iVar6 * sVar8);
          } while (uVar29 != uVar7);
        }
        if (bVar34 && 0 < (int)uVar12) {
          pvVar9 = bottom_blob->data;
          lVar14 = (long)bottom_blob->w * bottom_blob->elemsize;
          iVar6 = top_blob->w;
          sVar8 = top_blob->elemsize;
          pvVar19 = (void *)((long)pvVar9 + lVar14);
          lVar14 = lVar14 * 2;
          uVar29 = 0;
          pvVar11 = pvVar20;
          do {
            if (0 < iVar24) {
              lVar10 = 0;
              iVar5 = iVar24;
              do {
                *(undefined4 *)((long)pvVar11 + lVar10 * 2) = *(undefined4 *)((long)pvVar9 + lVar10)
                ;
                *(undefined4 *)((long)pvVar11 + lVar10 * 2 + 4) =
                     *(undefined4 *)((long)pvVar9 + lVar10 + 4);
                *(undefined4 *)((long)pvVar11 + lVar10 * 2 + 8) =
                     *(undefined4 *)((long)pvVar9 + lVar10 + 8);
                *(undefined4 *)((long)pvVar11 + lVar10 * 2 + 0xc) =
                     *(undefined4 *)((long)pvVar9 + lVar10 + 0xc);
                *(undefined4 *)((long)pvVar11 + lVar10 * 2 + 0x10) =
                     *(undefined4 *)((long)pvVar19 + lVar10);
                *(undefined4 *)((long)pvVar11 + lVar10 * 2 + 0x14) =
                     *(undefined4 *)((long)pvVar19 + lVar10 + 4);
                *(undefined4 *)((long)pvVar11 + lVar10 * 2 + 0x18) =
                     *(undefined4 *)((long)pvVar19 + lVar10 + 8);
                *(undefined4 *)((long)pvVar11 + lVar10 * 2 + 0x1c) =
                     *(undefined4 *)((long)pvVar19 + lVar10 + 0xc);
                lVar10 = lVar10 + 0x10;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
            uVar29 = uVar29 + 1;
            pvVar11 = (void *)((long)pvVar11 + (long)iVar6 * sVar8);
            pvVar19 = (void *)((long)pvVar19 + lVar14);
            pvVar9 = (void *)((long)pvVar9 + lVar14);
          } while (uVar29 != uVar12);
        }
        if ((bool)(bVar15 & 0 < (int)uVar17)) {
          pvVar9 = bottom_blob->data;
          iVar6 = bottom_blob->w;
          lVar14 = (long)top_blob->w * top_blob->elemsize;
          pvVar19 = (void *)((long)pvVar20 + lVar14);
          lVar14 = lVar14 * 2;
          sVar8 = bottom_blob->elemsize;
          uVar29 = 0;
          do {
            if (0 < iVar24) {
              lVar10 = 0;
              iVar5 = iVar24;
              do {
                *(undefined4 *)((long)pvVar20 + lVar10) = *(undefined4 *)((long)pvVar9 + lVar10 * 2)
                ;
                *(undefined4 *)((long)pvVar20 + lVar10 + 4) =
                     *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 4);
                *(undefined4 *)((long)pvVar20 + lVar10 + 8) =
                     *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 8);
                *(undefined4 *)((long)pvVar20 + lVar10 + 0xc) =
                     *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 0xc);
                *(undefined4 *)((long)pvVar19 + lVar10) =
                     *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 0x10);
                *(undefined4 *)((long)pvVar19 + lVar10 + 4) =
                     *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 0x14);
                *(undefined4 *)((long)pvVar19 + lVar10 + 8) =
                     *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 0x18);
                *(undefined4 *)((long)pvVar19 + lVar10 + 0xc) =
                     *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 0x1c);
                lVar10 = lVar10 + 0x10;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
            uVar29 = uVar29 + 1;
            pvVar19 = (void *)((long)pvVar19 + lVar14);
            pvVar20 = (void *)((long)pvVar20 + lVar14);
            pvVar9 = (void *)((long)pvVar9 + (long)iVar6 * sVar8);
          } while (uVar29 != uVar7);
          return 0;
        }
      }
      else {
        Mat::operator=(top_blob,bottom_blob);
      }
    }
    else if (iVar1 == 1) {
      iVar24 = iVar24 * iVar6;
      Mat::operator=(top_blob,bottom_blob);
      if (iVar24 % iVar5 == 0) {
        pp_Var3 = this->_vptr_Packing_x86;
        top_blob->w = iVar24 / *(int *)(&this->field_0xd0 + (long)pp_Var3[-3]);
        top_blob->cstep = (long)(iVar24 / *(int *)(&this->field_0xd0 + (long)pp_Var3[-3]));
        top_blob->elemsize =
             (long)*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) * (uVar22 / uVar29);
        top_blob->elempack = *(int *)(&this->field_0xd0 + (long)pp_Var3[-3]);
        return 0;
      }
    }
    else {
      if (1 < iVar1 - 3U) {
        return 0;
      }
      uVar12 = bottom_blob->c;
      uVar7 = (ulong)uVar12;
      if ((int)(iVar6 * uVar12) % iVar5 != 0) {
        Mat::operator=(top_blob,bottom_blob);
        return 0;
      }
      iVar26 = bottom_blob->d;
      uVar16 = (int)(iVar6 * uVar12) / iVar5;
      sVar8 = (uVar22 / uVar29) * (long)iVar5;
      if (iVar1 == 3) {
        Mat::create(top_blob,iVar24,uVar17,uVar16,sVar8,iVar5,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,iVar24,uVar17,iVar26,uVar16,sVar8,iVar5,opt->blob_allocator);
      }
      pvVar20 = top_blob->data;
      if (pvVar20 == (void *)0x0) {
        return -100;
      }
      local_48 = top_blob->cstep;
      if ((long)top_blob->c * local_48 == 0) {
        return -100;
      }
      iVar26 = iVar24 * uVar17 * iVar26;
      uVar29 = (ulong)uVar16;
      if (bVar32 && 0 < (int)uVar16) {
        pvVar9 = bottom_blob->data;
        lVar10 = bottom_blob->cstep * bottom_blob->elemsize;
        sVar8 = top_blob->elemsize;
        pvVar18 = (void *)(lVar10 * 3 + (long)pvVar9);
        lVar14 = lVar10 * 4;
        pvVar19 = (void *)((long)pvVar9 + lVar10 * 2);
        pvVar11 = (void *)(lVar10 + (long)pvVar9);
        uVar22 = 0;
        do {
          if (0 < iVar26) {
            puVar30 = (undefined4 *)(sVar8 * local_48 * uVar22 + (long)pvVar20);
            lVar10 = 0;
            do {
              *puVar30 = *(undefined4 *)((long)pvVar9 + lVar10 * 4);
              puVar30[1] = *(undefined4 *)((long)pvVar11 + lVar10 * 4);
              puVar30[2] = *(undefined4 *)((long)pvVar19 + lVar10 * 4);
              puVar30[3] = *(undefined4 *)((long)pvVar18 + lVar10 * 4);
              puVar30 = puVar30 + 4;
              lVar10 = lVar10 + 1;
            } while (iVar26 != (int)lVar10);
          }
          uVar22 = uVar22 + 1;
          pvVar18 = (void *)((long)pvVar18 + lVar14);
          pvVar19 = (void *)((long)pvVar19 + lVar14);
          pvVar11 = (void *)((long)pvVar11 + lVar14);
          pvVar9 = (void *)((long)pvVar9 + lVar14);
        } while (uVar22 != uVar29);
      }
      if ((bool)(bVar33 & 0 < (int)uVar12)) {
        pvVar9 = bottom_blob->data;
        sVar8 = bottom_blob->cstep;
        sVar4 = bottom_blob->elemsize;
        pvVar11 = top_blob->data;
        lVar10 = local_48 * top_blob->elemsize;
        local_48 = top_blob->cstep;
        lVar14 = top_blob->elemsize * local_48;
        pvVar18 = (void *)(lVar14 * 3 + (long)pvVar11);
        pvVar20 = (void *)((long)pvVar11 + lVar10 * 2);
        pvVar19 = (void *)((long)pvVar11 + lVar10);
        lVar10 = lVar10 * 4;
        uVar22 = 0;
        do {
          if (0 < iVar26) {
            puVar30 = (undefined4 *)(sVar8 * sVar4 * uVar22 + (long)pvVar9);
            lVar27 = 0;
            do {
              *(undefined4 *)((long)pvVar11 + lVar27 * 4) = *puVar30;
              *(undefined4 *)((long)pvVar19 + lVar27 * 4) = puVar30[1];
              *(undefined4 *)((long)pvVar20 + lVar27 * 4) = puVar30[2];
              *(undefined4 *)((long)pvVar18 + lVar27 * 4) = puVar30[3];
              puVar30 = puVar30 + 4;
              lVar27 = lVar27 + 1;
            } while (iVar26 != (int)lVar27);
          }
          uVar22 = uVar22 + 1;
          pvVar18 = (void *)((long)pvVar18 + lVar14 * 4);
          pvVar20 = (void *)((long)pvVar20 + lVar10);
          pvVar19 = (void *)((long)pvVar19 + lVar10);
          pvVar11 = (void *)((long)pvVar11 + lVar10);
        } while (uVar22 != uVar7);
      }
      if ((bool)(bVar35 & 0 < (int)uVar16)) {
        pvVar11 = bottom_blob->data;
        lVar10 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar18 = top_blob->data;
        sVar8 = top_blob->elemsize;
        lVar14 = lVar10 * 8;
        pvVar23 = (void *)(lVar10 * 7 + (long)pvVar11);
        pvVar20 = (void *)((long)pvVar11 + lVar10 * 6);
        pvVar28 = (void *)(lVar10 * 5 + (long)pvVar11);
        pvVar19 = (void *)((long)pvVar11 + lVar10 * 4);
        pvVar31 = (void *)(lVar10 * 3 + (long)pvVar11);
        pvVar9 = (void *)((long)pvVar11 + lVar10 * 2);
        pvVar13 = (void *)(lVar10 + (long)pvVar11);
        uVar22 = 0;
        do {
          if (0 < iVar26) {
            lVar10 = 0;
            uVar17 = iVar26 + 1;
            do {
              *(undefined4 *)((long)pvVar18 + lVar10 * 8) = *(undefined4 *)((long)pvVar11 + lVar10);
              *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 4) =
                   *(undefined4 *)((long)pvVar13 + lVar10);
              *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 8) =
                   *(undefined4 *)((long)pvVar9 + lVar10);
              *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0xc) =
                   *(undefined4 *)((long)pvVar31 + lVar10);
              *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x10) =
                   *(undefined4 *)((long)pvVar19 + lVar10);
              *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x14) =
                   *(undefined4 *)((long)pvVar28 + lVar10);
              *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x18) =
                   *(undefined4 *)((long)pvVar20 + lVar10);
              *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x1c) =
                   *(undefined4 *)((long)pvVar23 + lVar10);
              uVar17 = uVar17 - 1;
              lVar10 = lVar10 + 4;
            } while (1 < uVar17);
          }
          uVar22 = uVar22 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar8 * local_48);
          pvVar23 = (void *)((long)pvVar23 + lVar14);
          pvVar20 = (void *)((long)pvVar20 + lVar14);
          pvVar28 = (void *)((long)pvVar28 + lVar14);
          pvVar19 = (void *)((long)pvVar19 + lVar14);
          pvVar31 = (void *)((long)pvVar31 + lVar14);
          pvVar9 = (void *)((long)pvVar9 + lVar14);
          pvVar13 = (void *)((long)pvVar13 + lVar14);
          pvVar11 = (void *)((long)pvVar11 + lVar14);
        } while (uVar22 != uVar29);
      }
      if ((bool)(bVar21 & 0 < (int)uVar12)) {
        pvVar18 = bottom_blob->data;
        sVar8 = bottom_blob->cstep;
        pvVar13 = top_blob->data;
        lVar27 = local_48 * top_blob->elemsize;
        local_48 = top_blob->cstep;
        lVar10 = top_blob->elemsize * local_48;
        lVar14 = lVar10 * 8;
        pvVar23 = (void *)(lVar10 * 7 + (long)pvVar13);
        pvVar20 = (void *)((long)pvVar13 + lVar10 * 6);
        pvVar28 = (void *)(lVar10 * 5 + (long)pvVar13);
        pvVar19 = (void *)((long)pvVar13 + lVar10 * 4);
        pvVar31 = (void *)(lVar10 * 3 + (long)pvVar13);
        pvVar9 = (void *)((long)pvVar13 + lVar27 * 2);
        pvVar11 = (void *)((long)pvVar13 + lVar27);
        lVar27 = lVar27 * 8;
        sVar4 = bottom_blob->elemsize;
        uVar22 = 0;
        do {
          if (0 < iVar26) {
            lVar10 = 0;
            uVar17 = iVar26 + 1;
            do {
              *(undefined4 *)((long)pvVar13 + lVar10) = *(undefined4 *)((long)pvVar18 + lVar10 * 8);
              *(undefined4 *)((long)pvVar11 + lVar10) =
                   *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 4);
              *(undefined4 *)((long)pvVar9 + lVar10) =
                   *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 8);
              *(undefined4 *)((long)pvVar31 + lVar10) =
                   *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0xc);
              *(undefined4 *)((long)pvVar19 + lVar10) =
                   *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x10);
              *(undefined4 *)((long)pvVar28 + lVar10) =
                   *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x14);
              *(undefined4 *)((long)pvVar20 + lVar10) =
                   *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x18);
              *(undefined4 *)((long)pvVar23 + lVar10) =
                   *(undefined4 *)((long)pvVar18 + lVar10 * 8 + 0x1c);
              uVar17 = uVar17 - 1;
              lVar10 = lVar10 + 4;
            } while (1 < uVar17);
          }
          uVar22 = uVar22 + 1;
          pvVar23 = (void *)((long)pvVar23 + lVar14);
          pvVar20 = (void *)((long)pvVar20 + lVar14);
          pvVar28 = (void *)((long)pvVar28 + lVar14);
          pvVar19 = (void *)((long)pvVar19 + lVar14);
          pvVar31 = (void *)((long)pvVar31 + lVar14);
          pvVar9 = (void *)((long)pvVar9 + lVar27);
          pvVar11 = (void *)((long)pvVar11 + lVar27);
          pvVar13 = (void *)((long)pvVar13 + lVar27);
          pvVar18 = (void *)((long)pvVar18 + sVar8 * sVar4);
        } while (uVar22 != uVar7);
      }
      if ((bool)(bVar34 & 0 < (int)uVar16)) {
        pvVar19 = bottom_blob->data;
        lVar14 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar9 = top_blob->data;
        sVar8 = top_blob->elemsize;
        pvVar20 = (void *)((long)pvVar19 + lVar14);
        lVar14 = lVar14 * 2;
        uVar22 = 0;
        do {
          if (0 < iVar26) {
            lVar10 = 0;
            iVar6 = iVar26;
            do {
              *(undefined4 *)((long)pvVar9 + lVar10 * 2) = *(undefined4 *)((long)pvVar19 + lVar10);
              *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 4) =
                   *(undefined4 *)((long)pvVar19 + lVar10 + 4);
              *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 8) =
                   *(undefined4 *)((long)pvVar19 + lVar10 + 8);
              *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 0xc) =
                   *(undefined4 *)((long)pvVar19 + lVar10 + 0xc);
              *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 0x10) =
                   *(undefined4 *)((long)pvVar20 + lVar10);
              *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 0x14) =
                   *(undefined4 *)((long)pvVar20 + lVar10 + 4);
              *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 0x18) =
                   *(undefined4 *)((long)pvVar20 + lVar10 + 8);
              *(undefined4 *)((long)pvVar9 + lVar10 * 2 + 0x1c) =
                   *(undefined4 *)((long)pvVar20 + lVar10 + 0xc);
              lVar10 = lVar10 + 0x10;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          uVar22 = uVar22 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar8 * local_48);
          pvVar20 = (void *)((long)pvVar20 + lVar14);
          pvVar19 = (void *)((long)pvVar19 + lVar14);
        } while (uVar22 != uVar29);
      }
      if ((bool)(bVar15 & 0 < (int)uVar12)) {
        pvVar19 = bottom_blob->data;
        sVar8 = bottom_blob->cstep;
        pvVar9 = top_blob->data;
        lVar14 = local_48 * top_blob->elemsize;
        pvVar20 = (void *)((long)pvVar9 + lVar14);
        lVar14 = lVar14 * 2;
        sVar4 = bottom_blob->elemsize;
        uVar29 = 0;
        do {
          if (0 < iVar26) {
            lVar10 = 0;
            iVar6 = iVar26;
            do {
              *(undefined4 *)((long)pvVar9 + lVar10) = *(undefined4 *)((long)pvVar19 + lVar10 * 2);
              *(undefined4 *)((long)pvVar9 + lVar10 + 4) =
                   *(undefined4 *)((long)pvVar19 + lVar10 * 2 + 4);
              *(undefined4 *)((long)pvVar9 + lVar10 + 8) =
                   *(undefined4 *)((long)pvVar19 + lVar10 * 2 + 8);
              *(undefined4 *)((long)pvVar9 + lVar10 + 0xc) =
                   *(undefined4 *)((long)pvVar19 + lVar10 * 2 + 0xc);
              *(undefined4 *)((long)pvVar20 + lVar10) =
                   *(undefined4 *)((long)pvVar19 + lVar10 * 2 + 0x10);
              *(undefined4 *)((long)pvVar20 + lVar10 + 4) =
                   *(undefined4 *)((long)pvVar19 + lVar10 * 2 + 0x14);
              *(undefined4 *)((long)pvVar20 + lVar10 + 8) =
                   *(undefined4 *)((long)pvVar19 + lVar10 * 2 + 0x18);
              *(undefined4 *)((long)pvVar20 + lVar10 + 0xc) =
                   *(undefined4 *)((long)pvVar19 + lVar10 * 2 + 0x1c);
              lVar10 = lVar10 + 0x10;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          uVar29 = uVar29 + 1;
          pvVar20 = (void *)((long)pvVar20 + lVar14);
          pvVar9 = (void *)((long)pvVar9 + lVar14);
          pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar4);
        } while (uVar29 != uVar7);
        return 0;
      }
    }
    return 0;
  }
LAB_002baa0c:
  iVar6 = Packing::forward(this_00,bottom_blob,top_blob,opt);
  return iVar6;
}

Assistant:

int Packing_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    if (use_padding)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    if (elembits != 32)
    {
        // non-fp32 type
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    bool pack1to4 = elempack == 1 && out_elempack == 4;
    bool pack4to1 = elempack == 4 && out_elempack == 1;
    bool pack1to8 = elempack == 1 && out_elempack == 8;
    bool pack8to1 = elempack == 8 && out_elempack == 1;
    bool pack4to8 = elempack == 4 && out_elempack == 8;
    bool pack8to4 = elempack == 8 && out_elempack == 4;

    if (!pack1to4 && !pack4to1 && !pack1to8 && !pack8to1 && !pack4to8 && !pack8to4)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        top_blob = bottom_blob;
        top_blob.w = w * elempack / out_elempack;
        top_blob.cstep = w * elempack / out_elempack;
        top_blob.elemsize = elemsize / elempack * out_elempack;
        top_blob.elempack = out_elempack;
        return 0;
    }

    if (dims == 2)
    {
        int outh = h * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 4);
                const float* r1 = bottom_blob.row(i * 4 + 1);
                const float* r2 = bottom_blob.row(i * 4 + 2);
                const float* r3 = bottom_blob.row(i * 4 + 3);

                float* outptr = top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;

                    outptr += 4;
                }
            }
        }
        if (pack4to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 4);
                float* outptr1 = top_blob.row(i * 4 + 1);
                float* outptr2 = top_blob.row(i * 4 + 2);
                float* outptr3 = top_blob.row(i * 4 + 3);

                for (int j = 0; j < w; j++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];

                    r0 += 4;
                }
            }
        }
        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 8);
                const float* r1 = bottom_blob.row(i * 8 + 1);
                const float* r2 = bottom_blob.row(i * 8 + 2);
                const float* r3 = bottom_blob.row(i * 8 + 3);
                const float* r4 = bottom_blob.row(i * 8 + 4);
                const float* r5 = bottom_blob.row(i * 8 + 5);
                const float* r6 = bottom_blob.row(i * 8 + 6);
                const float* r7 = bottom_blob.row(i * 8 + 7);

                float* outptr = top_blob.row(i);

#if __AVX__
                int nn = w >> 3;
                int remain = w & 7;
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r1);
                    __m256 _row2 = _mm256_loadu_ps(r2);
                    __m256 _row3 = _mm256_loadu_ps(r3);
                    __m256 _row4 = _mm256_loadu_ps(r4);
                    __m256 _row5 = _mm256_loadu_ps(r5);
                    __m256 _row6 = _mm256_loadu_ps(r6);
                    __m256 _row7 = _mm256_loadu_ps(r7);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    r3 += 8;
                    r4 += 8;
                    r5 += 8;
                    r6 += 8;
                    r7 += 8;
                    outptr += 64;
                }
#else
                int remain = w;
#endif

                for (; remain > 0; remain--)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 8);
                float* outptr1 = top_blob.row(i * 8 + 1);
                float* outptr2 = top_blob.row(i * 8 + 2);
                float* outptr3 = top_blob.row(i * 8 + 3);
                float* outptr4 = top_blob.row(i * 8 + 4);
                float* outptr5 = top_blob.row(i * 8 + 5);
                float* outptr6 = top_blob.row(i * 8 + 6);
                float* outptr7 = top_blob.row(i * 8 + 7);
#if __AVX__
                int nn = w >> 3;
                int remain = w & 7;
#else
                int remain = w;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r0 + 8);
                    __m256 _row2 = _mm256_loadu_ps(r0 + 16);
                    __m256 _row3 = _mm256_loadu_ps(r0 + 24);
                    __m256 _row4 = _mm256_loadu_ps(r0 + 32);
                    __m256 _row5 = _mm256_loadu_ps(r0 + 40);
                    __m256 _row6 = _mm256_loadu_ps(r0 + 48);
                    __m256 _row7 = _mm256_loadu_ps(r0 + 56);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    r0 += 64;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                }
#endif
                for (; remain > 0; remain--)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }
        if (pack4to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 2);
                const float* r1 = bottom_blob.row(i * 2 + 1);

                float* outptr = top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    outptr[0] = r0[0];
                    outptr[1] = r0[1];
                    outptr[2] = r0[2];
                    outptr[3] = r0[3];
                    outptr[4] = r1[0];
                    outptr[5] = r1[1];
                    outptr[6] = r1[2];
                    outptr[7] = r1[3];

                    r0 += 4;
                    r1 += 4;
                    outptr += 8;
                }
            }
        }
        if (pack8to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 2);
                float* outptr1 = top_blob.row(i * 2 + 1);

                for (int j = 0; j < w; j++)
                {
                    outptr0[0] = r0[0];
                    outptr0[1] = r0[1];
                    outptr0[2] = r0[2];
                    outptr0[3] = r0[3];
                    outptr1[0] = r0[4];
                    outptr1[1] = r0[5];
                    outptr1[2] = r0[6];
                    outptr1[3] = r0[7];

                    r0 += 8;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int size = w * h * d;
        int outc = channels * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3)
            top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        else // if (dims == 4)
            top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 4);
                const float* r1 = bottom_blob.channel(q * 4 + 1);
                const float* r2 = bottom_blob.channel(q * 4 + 2);
                const float* r3 = bottom_blob.channel(q * 4 + 3);

                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;

                    outptr += 4;
                }
            }
        }
        if (pack4to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 4);
                float* outptr1 = top_blob.channel(q * 4 + 1);
                float* outptr2 = top_blob.channel(q * 4 + 2);
                float* outptr3 = top_blob.channel(q * 4 + 3);

                for (int i = 0; i < size; i++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];

                    r0 += 4;
                }
            }
        }
        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 8);
                const float* r1 = bottom_blob.channel(q * 8 + 1);
                const float* r2 = bottom_blob.channel(q * 8 + 2);
                const float* r3 = bottom_blob.channel(q * 8 + 3);
                const float* r4 = bottom_blob.channel(q * 8 + 4);
                const float* r5 = bottom_blob.channel(q * 8 + 5);
                const float* r6 = bottom_blob.channel(q * 8 + 6);
                const float* r7 = bottom_blob.channel(q * 8 + 7);

                float* outptr = top_blob.channel(q);

#if __AVX__
                int nn = size >> 3;
                int remain = size & 7;
#else
                int remain = size;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r1);
                    __m256 _row2 = _mm256_loadu_ps(r2);
                    __m256 _row3 = _mm256_loadu_ps(r3);
                    __m256 _row4 = _mm256_loadu_ps(r4);
                    __m256 _row5 = _mm256_loadu_ps(r5);
                    __m256 _row6 = _mm256_loadu_ps(r6);
                    __m256 _row7 = _mm256_loadu_ps(r7);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    r3 += 8;
                    r4 += 8;
                    r5 += 8;
                    r6 += 8;
                    r7 += 8;
                    outptr += 64;
                }
#endif
                for (; remain > 0; remain--)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 8);
                float* outptr1 = top_blob.channel(q * 8 + 1);
                float* outptr2 = top_blob.channel(q * 8 + 2);
                float* outptr3 = top_blob.channel(q * 8 + 3);
                float* outptr4 = top_blob.channel(q * 8 + 4);
                float* outptr5 = top_blob.channel(q * 8 + 5);
                float* outptr6 = top_blob.channel(q * 8 + 6);
                float* outptr7 = top_blob.channel(q * 8 + 7);
#if __AVX__
                int nn = size >> 3;
                int remain = size & 7;
#else
                int remain = size;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r0 + 8);
                    __m256 _row2 = _mm256_loadu_ps(r0 + 16);
                    __m256 _row3 = _mm256_loadu_ps(r0 + 24);
                    __m256 _row4 = _mm256_loadu_ps(r0 + 32);
                    __m256 _row5 = _mm256_loadu_ps(r0 + 40);
                    __m256 _row6 = _mm256_loadu_ps(r0 + 48);
                    __m256 _row7 = _mm256_loadu_ps(r0 + 56);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    r0 += 64;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                }
#endif

                for (; remain > 0; remain--)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }
        if (pack4to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 2);
                const float* r1 = bottom_blob.channel(q * 2 + 1);

                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[0] = r0[0];
                    outptr[1] = r0[1];
                    outptr[2] = r0[2];
                    outptr[3] = r0[3];
                    outptr[4] = r1[0];
                    outptr[5] = r1[1];
                    outptr[6] = r1[2];
                    outptr[7] = r1[3];

                    r0 += 4;
                    r1 += 4;
                    outptr += 8;
                }
            }
        }
        if (pack8to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    outptr0[0] = r0[0];
                    outptr0[1] = r0[1];
                    outptr0[2] = r0[2];
                    outptr0[3] = r0[3];
                    outptr1[0] = r0[4];
                    outptr1[1] = r0[5];
                    outptr1[2] = r0[6];
                    outptr1[3] = r0[7];

                    r0 += 8;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }
        }

        return 0;
    }

    return 0;
}